

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chunk.cpp
# Opt level: O0

ostream * operator<<(ostream *out,Chunk *chunk)

{
  _Setw _Var1;
  ostream *poVar2;
  void *pvVar3;
  long in_RSI;
  ostream *in_RDI;
  uint x;
  uint y;
  uint local_18;
  uint local_14;
  
  for (local_14 = 0; local_14 < 0x20; local_14 = local_14 + 1) {
    for (local_18 = 0; local_18 < 0x20; local_18 = local_18 + 1) {
      _Var1 = Catch::clara::std::setw(8);
      poVar2 = std::operator<<(in_RDI,(_Setw)_Var1._M_n);
      pvVar3 = (void *)std::ostream::operator<<(poVar2,Catch::clara::std::hex);
      pvVar3 = (void *)std::ostream::operator<<
                                 (pvVar3,*(uint *)(in_RSI + (ulong)(local_14 * 0x20 + local_18) * 4)
                                 );
      poVar2 = (ostream *)std::ostream::operator<<(pvVar3,std::dec);
      std::operator<<(poVar2," ");
    }
    std::operator<<(in_RDI,"\n");
  }
  return in_RDI;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const Chunk& chunk) {
    for (unsigned int y = 0; y < Chunk::WIDTH; ++y) {
        for (unsigned int x = 0; x < Chunk::WIDTH; ++x) {
            out << std::setw(8) << std::hex << *reinterpret_cast<const uint32_t*>(&chunk.tiles_[y * Chunk::WIDTH + x]) << std::dec << " ";
        }
        out << "\n";
    }
    return out;
}